

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall imrt::Station::generate_random_intensities(Station *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pair<int,_int> pVar4;
  int j;
  ulong uVar5;
  ulong uVar6;
  int i;
  long lVar7;
  list<int,_std::allocator<int>_> in;
  vector<int,_std::allocator<int>_> values;
  
  clearIntensity(this);
  std::vector<int,_std::allocator<int>_>::vector
            (&values,(long)this->max_apertures + 1,(allocator_type *)&in);
  *values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 0
  ;
  for (lVar7 = 1; lVar7 <= this->max_apertures; lVar7 = lVar7 + 1) {
    iVar1 = rand();
    values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar7] = (int)((double)(iVar1 % (this->max_intensity + 1)) * 0.5);
  }
  iVar1 = 0;
  while( true ) {
    iVar2 = Collimator::getXdim(this->collimator);
    if (iVar2 <= iVar1) break;
    in.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
    in.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)&in;
    in.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev =
         (_List_node_base *)&in;
    pVar4 = Collimator::getActiveRange(this->collimator,iVar1,this->angle);
    if (-1 < pVar4.first) {
      uVar6 = (ulong)pVar4 >> 0x20;
      for (uVar5 = (ulong)pVar4 & 0xffffffff; (int)uVar5 <= pVar4.second;
          uVar5 = (ulong)((int)uVar5 + 1)) {
        iVar2 = rand();
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  (&in,values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar2 % (this->max_apertures + 1));
      }
      std::__cxx11::list<int,_std::allocator<int>_>::sort(&in);
      while (in.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
             _M_next != (_List_node_base *)&in) {
        uVar3 = rand();
        if ((uVar3 & 1) == 0) {
          change_intensity(this,iVar1,(int)uVar6,
                           (double)*(int *)&in.super__List_base<int,_std::allocator<int>_>._M_impl.
                                            _M_node.super__List_node_base._M_next[1]._M_next,
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )0x0);
          uVar6 = (ulong)((int)uVar6 - 1);
        }
        else {
          change_intensity(this,iVar1,pVar4.first,
                           (double)*(int *)&in.super__List_base<int,_std::allocator<int>_>._M_impl.
                                            _M_node.super__List_node_base._M_next[1]._M_next,
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )0x0);
          pVar4.first = pVar4.first + 1;
          pVar4.second = 0;
        }
        std::__cxx11::list<int,_std::allocator<int>_>::pop_front(&in);
      }
    }
    std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
              ((_List_base<int,_std::allocator<int>_> *)&in);
    iVar1 = iVar1 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void Station::generate_random_intensities(){
    clearIntensity();

    vector<int> values(max_apertures+1);
    values[0] = 0;
    for(int i=1; i<max_apertures+1;i++){
      int in=rand()%(max_intensity+1)/2.0;
      values[i]=in;
    }

    for (int i=0; i < collimator.getXdim(); i++) {
      list<int> in;
      pair <int,int> aux = collimator.getActiveRange(i,angle);
      if(aux.first<0) continue;

      for (int j=aux.first; j<=aux.second; j++)
        in.push_back(values[rand()%(max_apertures+1)]);
      in.sort();

      int left=aux.first,right=aux.second;
      while(!in.empty()){
        if(rand()%2)
          change_intensity(i, left++, in.front());
        else
          change_intensity(i, right--, in.front());
        in.pop_front();
      }
    }
  //  printIntensity();
  }